

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIndexingTests.cpp
# Opt level: O0

char * deqp::getVectorAccessTypeName(VectorAccessType accessType)

{
  VectorAccessType accessType_local;
  
  return getVectorAccessTypeName::s_names[(int)accessType];
}

Assistant:

static const char* getVectorAccessTypeName(VectorAccessType accessType)
{
	static const char* s_names[VECTORACCESS_LAST] = { "direct",
													  "component",
													  "static_subscript",
													  "dynamic_subscript",
													  "static_loop_subscript",
													  "dynamic_loop_subscript" };

	DE_ASSERT(deInBounds32((int)accessType, 0, VECTORACCESS_LAST));
	return s_names[(int)accessType];
}